

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int64_t GetPos(GmfMshSct *msh)

{
  int IntVal;
  int local_14;
  int64_t local_10;
  
  if (msh->ver < 3) {
    ScaWrd(msh,&local_14);
    local_10 = (int64_t)local_14;
  }
  else {
    ScaDblWrd(msh,&local_10);
  }
  return local_10;
}

Assistant:

static int64_t GetPos(GmfMshSct *msh)
{
   int      IntVal;
   int64_t  pos;

   if(msh->ver >= 3)
      ScaDblWrd(msh, (unsigned char*)&pos);
   else
   {
      ScaWrd(msh, (unsigned char*)&IntVal);
      pos = (int64_t)IntVal;
   }

   return(pos);
}